

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromConnectionString
          (char *connectionString,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool use_dev_auth;
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  IOTHUB_CLIENT_CONFIG *client_config;
  STRING_HANDLE handle;
  STRING_TOKENIZER_HANDLE_conflict tokenizer;
  STRING_HANDLE output;
  STRING_HANDLE output_00;
  STRING_HANDLE output_01;
  STRING_HANDLE output_02;
  char *pcVar5;
  LOGGER_LOG p_Var6;
  STRING_TOKENIZER_HANDLE_conflict tokenizer_00;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar7;
  char *local_a8;
  STRING_HANDLE local_a0;
  STRING_HANDLE local_98;
  STRING_HANDLE local_90;
  STRING_HANDLE local_78;
  STRING_HANDLE local_70;
  char *local_60;
  char *local_58;
  char *local_48;
  char *local_40;
  
  if (connectionString == (char *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar5 = "Input parameter is NULL: connectionString";
    iVar4 = 0x56c;
LAB_0011f883:
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar4,1,pcVar5);
    return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
  }
  if (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar5 = "Input parameter is NULL: protocol";
    iVar4 = 0x571;
    goto LAB_0011f883;
  }
  client_config = (IOTHUB_CLIENT_CONFIG *)calloc(1,0x38);
  if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar5 = "Malloc failed";
    iVar4 = 0x579;
    goto LAB_0011f883;
  }
  client_config->protocol = protocol;
  handle = STRING_construct(connectionString);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
    }
    else {
      pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x591,1,
                "Error constructing connection String");
    }
    goto LAB_0011ff06;
  }
  tokenizer = STRING_TOKENIZER_create(handle);
  if (tokenizer == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar5 = "Error creating Tokenizer";
      iVar4 = 0x596;
LAB_0011f933:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar4,1,pcVar5);
    }
LAB_0011f93d:
    local_90 = (STRING_HANDLE)0x0;
    local_78 = (STRING_HANDLE)0x0;
    pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
  }
  else {
    output = STRING_new();
    if (output == (STRING_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar5 = "Error creating Token String";
        iVar4 = 0x59b;
        goto LAB_0011f933;
      }
      goto LAB_0011f93d;
    }
    output_00 = STRING_new();
    if (output_00 == (STRING_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a0,1,
                  "Error creating Value String");
      }
      pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      local_78 = (STRING_HANDLE)0x0;
      local_90 = (STRING_HANDLE)0x0;
    }
    else {
      output_01 = STRING_new();
      if (output_01 == (STRING_HANDLE)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a5,1,
                    "Error creating HostName String");
        }
        local_90 = (STRING_HANDLE)0x0;
        local_78 = (STRING_HANDLE)0x0;
        pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      }
      else {
        output_02 = STRING_new();
        if (output_02 == (STRING_HANDLE)0x0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5aa,1,
                      "Error creating HostSuffix String");
          }
          pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
          local_78 = (STRING_HANDLE)0x0;
          local_90 = (STRING_HANDLE)0x0;
        }
        else {
          local_58 = (char *)0x0;
          local_60 = (char *)0x0;
          local_48 = (char *)0x0;
          local_40 = (char *)0x0;
          local_a8 = (char *)0x0;
          local_90 = (STRING_HANDLE)0x0;
          local_78 = (STRING_HANDLE)0x0;
          local_70 = (STRING_HANDLE)0x0;
          local_98 = (STRING_HANDLE)0x0;
          local_a0 = (STRING_HANDLE)0x0;
          _Var2 = false;
          bVar3 = 0;
          do {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      bVar1 = bVar3;
                      use_dev_auth = _Var2;
                      iVar4 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
                      if (iVar4 != 0) goto LAB_0011fc9c;
                      iVar4 = STRING_TOKENIZER_get_next_token(tokenizer,output_00,";");
                      if (iVar4 != 0) {
                        p_Var6 = xlogging_get_log_function();
                        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011fc9c;
                        pcVar5 = "Tokenizer error";
                        iVar4 = 0x5b5;
                        goto LAB_0011fc97;
                      }
                      pcVar5 = STRING_c_str(output);
                      iVar4 = strcmp(pcVar5,"HostName");
                      _Var2 = use_dev_auth;
                      bVar3 = bVar1;
                      if (iVar4 != 0) break;
                      tokenizer_00 = STRING_TOKENIZER_create(output_00);
                      if (tokenizer_00 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
                        p_Var6 = xlogging_get_log_function();
                        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011fc9c;
                        pcVar5 = "Error creating Tokenizer";
                        iVar4 = 0x5c2;
                        goto LAB_0011fc97;
                      }
                      iVar4 = STRING_TOKENIZER_get_next_token(tokenizer_00,output_01,".");
                      if (iVar4 != 0) {
                        p_Var6 = xlogging_get_log_function();
                        if (p_Var6 != (LOGGER_LOG)0x0) {
                          (*p_Var6)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5c9,1,
                                    "Tokenizer error");
                        }
                        STRING_TOKENIZER_destroy(tokenizer_00);
                        goto LAB_0011fc9c;
                      }
                      local_a8 = STRING_c_str(output_01);
                      client_config->iotHubName = local_a8;
                      iVar4 = STRING_TOKENIZER_get_next_token(tokenizer_00,output_02,";");
                      if (iVar4 != 0) {
                        p_Var6 = xlogging_get_log_function();
                        if (p_Var6 != (LOGGER_LOG)0x0) {
                          (*p_Var6)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5d2,1,
                                    "Tokenizer error");
                        }
                        STRING_TOKENIZER_destroy(tokenizer_00);
                        goto LAB_0011fc9c;
                      }
                      local_40 = STRING_c_str(output_02);
                      client_config->iotHubSuffix = local_40;
                      STRING_TOKENIZER_destroy(tokenizer_00);
                    }
                    iVar4 = strcmp(pcVar5,"DeviceId");
                    if (iVar4 != 0) break;
                    local_a0 = STRING_clone(output_00);
                    if (local_a0 == (STRING_HANDLE)0x0) {
                      p_Var6 = xlogging_get_log_function();
                      if (p_Var6 == (LOGGER_LOG)0x0) {
                        local_a0 = (STRING_HANDLE)0x0;
                        goto LAB_0011fc9c;
                      }
                      pcVar5 = "Failure cloning device id string";
                      local_a0 = (STRING_HANDLE)0x0;
                      iVar4 = 0x5e7;
                      goto LAB_0011fc97;
                    }
                    local_48 = STRING_c_str(local_a0);
                    client_config->deviceId = local_48;
                  }
                  iVar4 = strcmp(pcVar5,"SharedAccessKey");
                  if (iVar4 != 0) break;
                  local_98 = STRING_clone(output_00);
                  if (local_98 == (STRING_HANDLE)0x0) {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 == (LOGGER_LOG)0x0) {
                      local_98 = (STRING_HANDLE)0x0;
                      goto LAB_0011fc9c;
                    }
                    pcVar5 = "Failure cloning device key string";
                    local_98 = (STRING_HANDLE)0x0;
                    iVar4 = 0x5f4;
                    goto LAB_0011fc97;
                  }
                  local_58 = STRING_c_str(local_98);
                  client_config->deviceKey = local_58;
                }
                iVar4 = strcmp(pcVar5,"SharedAccessSignature");
                if (iVar4 != 0) break;
                local_70 = STRING_clone(output_00);
                if (local_70 == (STRING_HANDLE)0x0) {
                  p_Var6 = xlogging_get_log_function();
                  if (p_Var6 == (LOGGER_LOG)0x0) {
                    local_70 = (STRING_HANDLE)0x0;
                    goto LAB_0011fc9c;
                  }
                  pcVar5 = "Failure cloning device sasToken string";
                  local_70 = (STRING_HANDLE)0x0;
                  iVar4 = 0x601;
                  goto LAB_0011fc97;
                }
                local_60 = STRING_c_str(local_70);
                client_config->deviceSasToken = local_60;
              }
              iVar4 = strcmp(pcVar5,"x509");
              if (iVar4 == 0) break;
              iVar4 = strcmp(pcVar5,"UseProvisioning");
              if (iVar4 == 0) {
                pcVar5 = STRING_c_str(output_00);
                iVar4 = strcmp(pcVar5,"true");
                _Var2 = true;
                if (iVar4 != 0) {
                  p_Var6 = xlogging_get_log_function();
                  if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011fc9c;
                  pcVar5 = 
                  "provisioning option has wrong value, the only acceptable one is \"true\"";
                  iVar4 = 0x615;
                  goto LAB_0011fc97;
                }
              }
              else {
                iVar4 = strcmp(pcVar5,"GatewayHostName");
                if (iVar4 == 0) {
                  local_78 = STRING_clone(output_00);
                  if (local_78 == (STRING_HANDLE)0x0) {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 == (LOGGER_LOG)0x0) {
                      local_78 = (STRING_HANDLE)0x0;
                      goto LAB_0011fc9c;
                    }
                    pcVar5 = "Failure cloning protocol Gateway Name";
                    local_78 = (STRING_HANDLE)0x0;
                    iVar4 = 0x627;
                    goto LAB_0011fc97;
                  }
                  pcVar5 = STRING_c_str(local_78);
                  client_config->protocolGatewayHostName = pcVar5;
                }
                else {
                  iVar4 = strcmp(pcVar5,"ModuleId");
                  if (iVar4 == 0) {
                    local_90 = STRING_clone(output_00);
                    if (local_90 == (STRING_HANDLE)0x0) {
                      p_Var6 = xlogging_get_log_function();
                      if (p_Var6 == (LOGGER_LOG)0x0) {
                        local_90 = (STRING_HANDLE)0x0;
                      }
                      else {
                        local_90 = (STRING_HANDLE)0x0;
                        (*p_Var6)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x630,1,
                                  "Failure cloning moduleId string");
                      }
                      goto LAB_0011fc9c;
                    }
                  }
                  else {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x637,1,
                                "Unknown token <%s> in connection string.  Ignoring error and continuing to parse"
                                ,pcVar5);
                    }
                  }
                }
              }
            }
            pcVar5 = STRING_c_str(output_00);
            iVar4 = strcmp(pcVar5,"true");
            bVar3 = 1;
          } while (iVar4 == 0);
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar5 = "x509 option has wrong value, the only acceptable one is \"true\"";
            iVar4 = 0x609;
LAB_0011fc97:
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar4,1,pcVar5);
          }
LAB_0011fc9c:
          if (local_a8 == (char *)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              pcVar5 = "iotHubName is not found";
              iVar4 = 0x63f;
LAB_0011fd7c:
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar4,1,pcVar5);
            }
LAB_0011fe64:
            pIVar7 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
          }
          else {
            if (local_40 == (char *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                pcVar5 = "iotHubSuffix is not found";
                iVar4 = 0x644;
                goto LAB_0011fd7c;
              }
              goto LAB_0011fe64;
            }
            if (local_48 == (char *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011fe64;
              pcVar5 = "deviceId is not found";
              iVar4 = 0x649;
LAB_0011fdc7:
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar4,1,pcVar5);
              goto LAB_0011fe64;
            }
            if ((bool)(bVar1 | use_dev_auth)) {
              if (local_60 != (char *)0x0 || local_58 != (char *)0x0) {
LAB_0011fce4:
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011fe64;
                pcVar5 = "invalid combination of x509, provisioning, deviceSasToken and deviceKey";
                iVar4 = 0x651;
                goto LAB_0011fdc7;
              }
            }
            else if ((local_60 == (char *)0x0) == (local_58 == (char *)0x0)) goto LAB_0011fce4;
            pcVar5 = STRING_c_str(local_90);
            pIVar7 = initialize_iothub_client
                               (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,pcVar5
                               );
            if (pIVar7 == (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                          ,"IoTHubClientCore_LL_CreateFromConnectionString",0x659,1,
                          "IoTHubClientCore_LL_Create failed");
              }
              goto LAB_0011fe64;
            }
          }
          if (local_70 != (STRING_HANDLE)0x0) {
            STRING_delete(local_70);
          }
          if (local_98 != (STRING_HANDLE)0x0) {
            STRING_delete(local_98);
          }
          if (local_a0 != (STRING_HANDLE)0x0) {
            STRING_delete(local_a0);
          }
          STRING_delete(output_02);
        }
        STRING_delete(output_01);
      }
      STRING_delete(output_00);
    }
    STRING_delete(output);
  }
  STRING_delete(handle);
  if (local_78 != (STRING_HANDLE)0x0) {
    STRING_delete(local_78);
  }
  if (local_90 != (STRING_HANDLE)0x0) {
    STRING_delete(local_90);
  }
  if (tokenizer != (STRING_TOKENIZER_HANDLE_conflict)0x0) {
    STRING_TOKENIZER_destroy(tokenizer);
  }
LAB_0011ff06:
  free(client_config);
  return pIVar7;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromConnectionString(const char* connectionString, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else if (protocol == NULL)
    {
        LogError("Input parameter is NULL: protocol");
        result = NULL;
    }
    else
    {
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*) malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            STRING_TOKENIZER_HANDLE tokenizer1 = NULL;
            STRING_HANDLE connString = NULL;
            STRING_HANDLE tokenString = NULL;
            STRING_HANDLE valueString = NULL;
            STRING_HANDLE hostNameString = NULL;
            STRING_HANDLE hostSuffixString = NULL;
            STRING_HANDLE deviceIdString = NULL;
            STRING_HANDLE deviceKeyString = NULL;
            STRING_HANDLE deviceSasTokenString = NULL;
            STRING_HANDLE protocolGateway = NULL;
            STRING_HANDLE moduleId = NULL;

            memset(config, 0, sizeof(*config));
            config->protocol = protocol;

            config->protocolGatewayHostName = NULL;

            if ((connString = STRING_construct(connectionString)) == NULL)
            {
                LogError("Error constructing connection String");
                result = NULL;
            }
            else if ((tokenizer1 = STRING_TOKENIZER_create(connString)) == NULL)
            {
                LogError("Error creating Tokenizer");
                result = NULL;
            }
            else if ((tokenString = STRING_new()) == NULL)
            {
                LogError("Error creating Token String");
                result = NULL;
            }
            else if ((valueString = STRING_new()) == NULL)
            {
                LogError("Error creating Value String");
                result = NULL;
            }
            else if ((hostNameString = STRING_new()) == NULL)
            {
                LogError("Error creating HostName String");
                result = NULL;
            }
            else if ((hostSuffixString = STRING_new()) == NULL)
            {
                LogError("Error creating HostSuffix String");
                result = NULL;
            }
            else
            {
                int isx509found = 0;
                bool use_provisioning = false;
                while ((STRING_TOKENIZER_get_next_token(tokenizer1, tokenString, "=") == 0))
                {
                    if (STRING_TOKENIZER_get_next_token(tokenizer1, valueString, ";") != 0)
                    {
                        LogError("Tokenizer error");
                        break;
                    }
                    else
                    {
                        if (tokenString != NULL)
                        {
                            const char* s_token = STRING_c_str(tokenString);
                            if (strcmp(s_token, HOSTNAME_TOKEN) == 0)
                            {
                                STRING_TOKENIZER_HANDLE tokenizer2 = NULL;
                                if ((tokenizer2 = STRING_TOKENIZER_create(valueString)) == NULL)
                                {
                                    LogError("Error creating Tokenizer");
                                    break;
                                }
                                else
                                {
                                    if (STRING_TOKENIZER_get_next_token(tokenizer2, hostNameString, ".") != 0)
                                    {
                                        LogError("Tokenizer error");
                                        STRING_TOKENIZER_destroy(tokenizer2);
                                        break;
                                    }
                                    else
                                    {
                                        config->iotHubName = STRING_c_str(hostNameString);
                                        if (STRING_TOKENIZER_get_next_token(tokenizer2, hostSuffixString, ";") != 0)
                                        {
                                            LogError("Tokenizer error");
                                            STRING_TOKENIZER_destroy(tokenizer2);
                                            break;
                                        }
                                        else
                                        {
                                            config->iotHubSuffix = STRING_c_str(hostSuffixString);
                                        }
                                    }
                                    STRING_TOKENIZER_destroy(tokenizer2);
                                }
                            }
                            else if (strcmp(s_token, DEVICEID_TOKEN) == 0)
                            {
                                deviceIdString = STRING_clone(valueString);
                                if (deviceIdString != NULL)
                                {
                                    config->deviceId = STRING_c_str(deviceIdString);
                                }
                                else
                                {
                                    LogError("Failure cloning device id string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICEKEY_TOKEN) == 0)
                            {
                                deviceKeyString = STRING_clone(valueString);
                                if (deviceKeyString != NULL)
                                {
                                    config->deviceKey = STRING_c_str(deviceKeyString);
                                }
                                else
                                {
                                    LogError("Failure cloning device key string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICESAS_TOKEN) == 0)
                            {
                                deviceSasTokenString = STRING_clone(valueString);
                                if (deviceSasTokenString != NULL)
                                {
                                    config->deviceSasToken = STRING_c_str(deviceSasTokenString);
                                }
                                else
                                {
                                    LogError("Failure cloning device sasToken string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, X509_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), X509_TOKEN_ONLY_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("x509 option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    isx509found = 1;
                                }
                            }
                            else if (strcmp(s_token, PROVISIONING_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), PROVISIONING_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("provisioning option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    use_provisioning = 1;
                                }
                            }

                            else if (strcmp(s_token, PROTOCOL_GATEWAY_HOST_TOKEN) == 0)
                            {
                                protocolGateway = STRING_clone(valueString);
                                if (protocolGateway != NULL)
                                {
                                    config->protocolGatewayHostName = STRING_c_str(protocolGateway);
                                }
                                else
                                {
                                    LogError("Failure cloning protocol Gateway Name");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, MODULE_ID_TOKEN) == 0)
                            {
                                moduleId = STRING_clone(valueString);
                                if (moduleId == NULL)
                                {
                                    LogError("Failure cloning moduleId string");
                                    break;
                                }
                            }
                            else
                            {
                                // If we get an unknown token, log it to error stream but do not cause a fatal error.
                                LogError("Unknown token <%s> in connection string.  Ignoring error and continuing to parse", s_token);
                            }
                        }
                    }
                }
                /* parsing is done - check the result */
                if (config->iotHubName == NULL)
                {
                    LogError("iotHubName is not found");
                    result = NULL;
                }
                else if (config->iotHubSuffix == NULL)
                {
                    LogError("iotHubSuffix is not found");
                    result = NULL;
                }
                else if (config->deviceId == NULL)
                {
                    LogError("deviceId is not found");
                    result = NULL;
                }
                else if (!(
                    ((!use_provisioning && !isx509found) && (config->deviceSasToken == NULL) ^ (config->deviceKey == NULL)) ||
                    ((use_provisioning || isx509found) && (config->deviceSasToken == NULL) && (config->deviceKey == NULL))
                    ))
                {
                    LogError("invalid combination of x509, provisioning, deviceSasToken and deviceKey");
                    result = NULL;
                }
                else
                {
                    result = initialize_iothub_client(config, NULL, use_provisioning, STRING_c_str(moduleId));
                    if (result == NULL)
                    {
                        LogError("IoTHubClientCore_LL_Create failed");
                    }
                    else
                    {
                        /*return as is*/
                    }
                }
            }
            if (deviceSasTokenString != NULL)
                STRING_delete(deviceSasTokenString);
            if (deviceKeyString != NULL)
                STRING_delete(deviceKeyString);
            if (deviceIdString != NULL)
                STRING_delete(deviceIdString);
            if (hostSuffixString != NULL)
                STRING_delete(hostSuffixString);
            if (hostNameString != NULL)
                STRING_delete(hostNameString);
            if (valueString != NULL)
                STRING_delete(valueString);
            if (tokenString != NULL)
                STRING_delete(tokenString);
            if (connString != NULL)
                STRING_delete(connString);
            if (protocolGateway != NULL)
                STRING_delete(protocolGateway);
            if (moduleId != NULL)
                STRING_delete(moduleId);

            if (tokenizer1 != NULL)
                STRING_TOKENIZER_destroy(tokenizer1);

            free(config);
        }
    }
    return result;
}